

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O3

void __thiscall
xray_re::xr_writer::w_raw_chunk(xr_writer *this,uint32_t id,void *data,size_t size,bool compress)

{
  _lzhuf *this_00;
  undefined7 in_register_00000081;
  uint8_t *compressed_data;
  size_t compressed_size;
  uint local_44;
  undefined8 local_40;
  uint local_38;
  undefined4 uStack_34;
  
  if ((int)CONCAT71(in_register_00000081,compress) == 0) {
    local_40._0_4_ = id;
    (*this->_vptr_xr_writer[2])(this,&local_40,4);
    local_40._0_4_ = (uint32_t)size;
    (*this->_vptr_xr_writer[2])(this,&local_40,4);
    (*this->_vptr_xr_writer[2])(this,data,size);
  }
  else {
    this_00 = &xr_lzhuf::instance()->m_lzhuf;
    _lzhuf::Encode(this_00,(uint8_t **)&local_40,(size_t *)&local_38,(uint8_t *)data,size);
    local_44 = id | 0x80000000;
    (*this->_vptr_xr_writer[2])(this,&local_44,4);
    local_44 = local_38;
    (*this->_vptr_xr_writer[2])(this,&local_44,4);
    (*this->_vptr_xr_writer[2])
              (this,CONCAT44(local_40._4_4_,(uint32_t)local_40),CONCAT44(uStack_34,local_38));
    free((void *)CONCAT44(local_40._4_4_,(uint32_t)local_40));
  }
  return;
}

Assistant:

void xr_writer::w_raw_chunk(uint32_t id, const void* data, size_t size, bool compress)
{
	if (compress)
	{
		uint8_t* compressed_data;
		size_t compressed_size;
		xr_lzhuf::compress(compressed_data, compressed_size, (const uint8_t*)data, size);

		w_u32(id|xr_reader::CHUNK_COMPRESSED);
		w_size_u32(compressed_size);
		w_raw(compressed_data, compressed_size);

		free(compressed_data);
	}
	else
	{
		w_u32(id);
		w_size_u32(size);
		w_raw(data, size);
	}
}